

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned__int128>::
num_writer::operator()(num_writer *this,char *it)

{
  undefined1 value [16];
  anon_class_40_4_2c7d0318 add_thousands_sep;
  char *pcVar1;
  undefined8 local_38;
  const_iterator group;
  undefined1 auStack_28 [4];
  int digit_index;
  basic_string_view<char> s;
  char *it_local;
  num_writer *this_local;
  
  s.size_ = (size_t)it;
  basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)auStack_28,(char *)(this + 0x20),1);
  group._M_current._4_4_ = 0;
  local_38 = std::__cxx11::string::cbegin();
  value._8_8_ = _auStack_28;
  value._0_8_ = this;
  add_thousands_sep.s.data_ = (char *)&local_38;
  add_thousands_sep.this = (num_writer *)s.data_;
  add_thousands_sep.s.size_ = (size_t)((long)&group._M_current + 4);
  add_thousands_sep.group = (const_iterator *)this;
  add_thousands_sep.digit_index = *(int **)this;
  pcVar1 = detail::operator()((char *)s.size_,(unsigned___int128)value,(int)*(int **)this,
                              add_thousands_sep);
  return pcVar1;
}

Assistant:

It operator()(It it) const {
      basic_string_view<Char> s(&sep, sep_size);
      // Index of a decimal digit with the least significant digit having
      // index 0.
      int digit_index = 0;
      std::string::const_iterator group = groups.cbegin();
      return format_decimal<Char>(
          it, abs_value, size, [this, s, &group, &digit_index](Char*& buffer) {
            if (*group <= 0 || ++digit_index % *group != 0 ||
                *group == max_value<char>())
              return;
            if (group + 1 != groups.cend()) {
              digit_index = 0;
              ++group;
            }
            buffer -= s.size();
            std::uninitialized_copy(s.data(), s.data() + s.size(),
                                    make_checked(buffer, s.size()));
          });
    }